

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void drawGui(void)

{
  undefined8 uVar1;
  cgltf_animation_path_type cVar2;
  cgltf_scene *pcVar3;
  cgltf_node *pcVar4;
  cgltf_mesh *pcVar5;
  ImVec2 IVar6;
  cgltf_data *pcVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  cgltf_attribute *pcVar13;
  cgltf_morph_target *ptr_id;
  u8 *puVar14;
  cgltf_texture *ptr_id_00;
  cgltf_image *this;
  cgltf_sampler *pcVar15;
  cgltf_sampler *this_00;
  cgltf_buffer *pcVar16;
  cgltf_buffer_view *pcVar17;
  cgltf_accessor *pcVar18;
  cgltf_material *material;
  cgltf_skin *pcVar19;
  cgltf_node **ppcVar20;
  cgltf_animation *pcVar21;
  cgltf_animation *pcVar22;
  size_t i;
  vec3 *pvVar23;
  NodeData *pNVar24;
  quat *pqVar25;
  cgltf_camera *ptr_id_01;
  cgltf_light *pcVar26;
  long lVar27;
  char (*xs) [2];
  long lVar28;
  size_t i_1;
  ulong uVar29;
  undefined8 *puVar30;
  cgltf_animation_channel *pcVar31;
  size_t i_7;
  cgltf_attribute *i_00;
  cgltf_size cVar32;
  u8 *puVar33;
  i32 sceneInd_00;
  CSpan<cgltf_attribute> *size_arg;
  cgltf_image *pcVar34;
  size_t primInd;
  cgltf_size cVar35;
  size_t i_2;
  cgltf_mesh *ptr_id_02;
  cgltf_primitive *ptr_id_03;
  i32 sceneInd;
  uint uVar36;
  ulong uVar37;
  cgltf_animation_sampler *pcVar38;
  void *ptr_id_04;
  size_t i_4;
  long lVar39;
  cgltf_image *i_01;
  cgltf_sampler *i_02;
  long lVar40;
  undefined4 uVar41;
  float fVar42;
  CStr str;
  CStr str_00;
  CSpan<cgltf_attribute> attributes;
  CSpan<cgltf_texture> textures;
  Span<char> local_a0;
  cgltf_sampler *local_90;
  u8 *local_88;
  Span<char> local_80;
  CSpan<cgltf_image> images;
  size_t requiredMem;
  size_t local_40;
  u8 *local_38;
  
  if (parsedData == (cgltf_data *)0x0) {
    ImGui::Begin("drag & drop a glTF file##0",(bool *)0x0,0);
    ImGui::End();
    return;
  }
  attributes._data = (cgltf_attribute *)0x3f8000003f800000;
  ImGui::PushStyleVar(1,(ImVec2 *)&attributes);
  uVar10 = (uint)scratch._size;
  pcVar11 = (char *)(ulong)(uint)scratch._size;
  attributes._data = (cgltf_attribute *)scratch._data;
  attributes._size = (size_t)scratch._data;
  tl::CStrT<char>::CStrT((CStrT<char> *)&textures,&openedFilePath);
  str._str = pcVar11;
  str._0_8_ = textures._size;
  tl::toStringBufferT((tl *)&attributes,(FmtBuffer *)((ulong)textures._data & 0xffffffff),str);
  tl::toStringBufferT((FmtBuffer *)&attributes,"##0");
  *(undefined1 *)(attributes._size - (uVar10 == 0)) = 0;
  ImGui::Begin((char *)scratch._data,(bool *)0x0,0);
  ImGui::PopStyleVar(1);
  bVar8 = ImGui::BeginTabBar("TopTabBar",0);
  if (bVar8) {
    bVar8 = ImGui::BeginTabItem("Scenes",(bool *)0x0,0);
    if (bVar8) {
      if ((drawGui_scenesTab()::rightPanelSize == '\0') &&
         (iVar9 = __cxa_guard_acquire(&drawGui_scenesTab()::rightPanelSize), iVar9 != 0)) {
        drawGui_scenesTab()::rightPanelSize = 1.0 - drawGui_scenesTab()::leftPanelSize;
        __cxa_guard_release(&drawGui_scenesTab()::rightPanelSize);
      }
      IVar6 = ImGui::GetWindowSize();
      drawGui_scenesTab()::leftPanelSize = drawGui_scenesTab()::leftPanelSize * IVar6.x;
      drawGui_scenesTab()::rightPanelSize = IVar6.x * drawGui_scenesTab()::rightPanelSize;
      Splitter(true,4.0,&drawGui_scenesTab()::leftPanelSize,&drawGui_scenesTab()::rightPanelSize,0.0
               ,0.0,-1.0);
      attributes._data = (cgltf_attribute *)0x4080000040800000;
      ImGui::PushStyleVar(0xd,(ImVec2 *)&attributes);
      attributes._data = (cgltf_attribute *)CONCAT44(0xbf800000,drawGui_scenesTab()::leftPanelSize);
      size_arg = &attributes;
      ImGui::BeginChild("left_panel",(ImVec2 *)size_arg,true,0x10000);
      pcVar11 = drawGui_scenesTab::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(ulong)imgui_state::selectedSceneInd,
                           (i32)size_arg);
      bVar8 = ImGui::BeginCombo("scene",pcVar11,0);
      if (bVar8) {
        lVar39 = 0;
        for (uVar37 = 0; sceneInd_00 = (i32)pcVar11,
            (long)uVar37 < (long)(int)parsedData->scenes_count; uVar37 = uVar37 + 1) {
          ImGui::PushID((void *)((long)&parsedData->scenes->name + lVar39));
          pcVar12 = drawGui_scenesTab::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)(uVar37 & 0xffffffff),sceneInd_00);
          attributes._data = (cgltf_attribute *)0x0;
          pcVar11 = (char *)0x0;
          bVar8 = ImGui::Selectable(pcVar12,false,0,(ImVec2 *)&attributes);
          if (bVar8) {
            imgui_state::selectedSceneInd = (uint)uVar37;
          }
          ImGui::PopID();
          lVar39 = lVar39 + 0x28;
        }
        ImGui::EndCombo();
      }
      lVar39 = (long)(int)imgui_state::selectedSceneInd;
      if (lVar39 != -1) {
        pcVar3 = parsedData->scenes;
        for (uVar37 = 0; uVar37 < pcVar3[lVar39].nodes_count; uVar37 = uVar37 + 1) {
          pcVar4 = pcVar3[lVar39].nodes[uVar37];
          if (pcVar4->parent == (cgltf_node *)0x0) {
            sceneNodeGuiRecursive(pcVar4);
          }
        }
      }
      ImGui::EndChild();
      ImGui::SameLine(0.0,-1.0);
      attributes._data = (cgltf_attribute *)CONCAT44(0xbf800000,drawGui_scenesTab()::rightPanelSize)
      ;
      ImGui::BeginChild("right_panel",(ImVec2 *)&attributes,true,0);
      if (selectedNode == (cgltf_node *)0x0) {
        ImGui::Text("Nothing selected");
      }
      else {
        lVar39 = (long)selectedNode - (long)parsedData->nodes;
        ImGui::Text("Node index: %ld",lVar39 / 0xd8,lVar39 % 0xd8);
        pcVar19 = selectedNode->skin;
        if (pcVar19 != (cgltf_skin *)0x0) {
          ImGui::Text("Skin: %s(%ld)",pcVar19->name,((long)pcVar19 - (long)parsedData->skins) / 0x38
                     );
        }
        if (selectedNode->mesh != (cgltf_mesh *)0x0) {
          lVar39 = (long)selectedNode->mesh - (long)parsedData->meshes;
          ImGui::Text("Mesh: %ld",lVar39 / 0x48,lVar39 % 0x48);
        }
        if (selectedNode->camera != (cgltf_camera *)0x0) {
          ImGui::Text("Camera: %ld");
        }
        if (selectedNode->light != (cgltf_light *)0x0) {
          lVar39 = (long)selectedNode->light - (long)parsedData->lights;
          ImGui::Text("Light: %ld",lVar39 / 0x28,lVar39 % 0x28);
        }
        if ((selectedNode->weights != (cgltf_float *)0x0) &&
           (bVar8 = ImGui::TreeNode(&selectedNode->weights,"Weights(%ld)",
                                    selectedNode->weights_count), bVar8)) {
          for (uVar37 = 0; uVar37 < selectedNode->weights_count; uVar37 = uVar37 + 1) {
            ImGui::Text("%g",SUB84((double)selectedNode->weights[uVar37],0));
          }
          ImGui::TreePop();
        }
        if (selectedNode->has_translation != 0) {
          ImGui::Text("Translation: {%g, %g, %g}",SUB84((double)selectedNode->translation[0],0),
                      (double)selectedNode->translation[1],(double)selectedNode->translation[2]);
        }
        if (selectedNode->has_rotation != 0) {
          ImGui::Text("Rotation: {%g, %g, %g, %g}",SUB84((double)selectedNode->rotation[0],0),
                      (double)selectedNode->rotation[1],(double)selectedNode->rotation[2],
                      SUB84((double)selectedNode->rotation[3],0));
        }
        if (selectedNode->has_scale != 0) {
          ImGui::Text("Scale: {%g, %g, %g}",SUB84((double)selectedNode->scale[0],0),
                      (double)selectedNode->scale[1],(double)selectedNode->scale[2]);
        }
        if (selectedNode->has_matrix != 0) {
          ImGui::Text("Matrix: {\n  %g, %g, %g, %g,\n  %g, %g, %g, %g,\n  %g, %g, %g, %g,\n  %g, %g, %g, %g}"
                      ,SUB84((double)selectedNode->matrix[0],0),(double)selectedNode->matrix[1],
                      (double)selectedNode->matrix[2],SUB84((double)selectedNode->matrix[3],0),
                      (double)selectedNode->matrix[4],(double)selectedNode->matrix[4],
                      (double)selectedNode->matrix[6],(double)selectedNode->matrix[7]);
        }
      }
      ImGui::EndChild();
      ImGui::PopStyleVar(1);
      IVar6 = ImGui::GetWindowSize();
      drawGui_scenesTab()::leftPanelSize = drawGui_scenesTab()::leftPanelSize / IVar6.x;
      IVar6 = ImGui::GetWindowSize();
      drawGui_scenesTab()::rightPanelSize = drawGui_scenesTab()::rightPanelSize / IVar6.x;
      ImGui::EndTabItem();
    }
    bVar8 = ImGui::BeginTabItem("Meshes",(bool *)0x0,0);
    if (bVar8) {
      pcVar5 = parsedData->meshes;
      puVar33 = (u8 *)parsedData->meshes_count;
      local_88 = puVar33;
      for (puVar14 = (u8 *)0x0; local_80._data = (char *)puVar14, puVar14 != puVar33;
          puVar14 = puVar14 + 1) {
        local_a0._size = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
        local_a0._data = (char *)scratch._data;
        attributes._data = (cgltf_attribute *)pcVar5[(long)puVar14].name;
        if (attributes._data == (cgltf_attribute *)0x0) {
          attributes._data = (cgltf_attribute *)0x2bb39b;
        }
        tl::toStringBuffer<unsigned_long,char[3],char_const*>
                  (&local_a0,(unsigned_long *)&local_80,(char (*) [3])&attributes,(char **)0x2bb39b)
        ;
        bVar8 = ImGui::CollapsingHeader((char *)scratch._data,0);
        if (bVar8) {
          ptr_id_02 = pcVar5 + (long)puVar14;
          ImGui::TreePush((void *)0x0);
          bVar8 = ImGui::TreeNode(ptr_id_02,"Primitives (%ld)",ptr_id_02->primitives_count);
          if (bVar8) {
            cVar32 = ptr_id_02->primitives_count;
            for (cVar35 = 0; cVar35 != cVar32; cVar35 = cVar35 + 1) {
              ptr_id_03 = ptr_id_02->primitives + cVar35;
              bVar8 = ImGui::TreeNode(ptr_id_03,"%ld",cVar35);
              if (bVar8) {
                cgltfPrimitiveTypeStr(ptr_id_03->type);
                ImGui::Text("Type: %s");
                pcVar18 = ptr_id_03->indices;
                if ((pcVar18 != (cgltf_accessor *)0x0) &&
                   (bVar8 = ImGui::TreeNode(pcVar18,"Indices (accessor %ld)",
                                            ((long)pcVar18 - (long)parsedData->accessors) / 0x130),
                   bVar8)) {
                  imguiAccessor(ptr_id_03->indices);
                  ImGui::TreePop();
                }
                if (ptr_id_03->material == (cgltf_material *)0x0) {
                  ImGui::Text("Material: NULL");
                }
                else {
                  bVar8 = ImGui::TreeNode(&ptr_id_03->material,"Material (%ld)",
                                          ((long)ptr_id_03->material - (long)parsedData->materials)
                                          / 0x248);
                  if (bVar8) {
                    imguiMaterial(ptr_id_03->material);
                    ImGui::TreePop();
                  }
                }
                bVar8 = ImGui::TreeNode("Attributes");
                if (bVar8) {
                  attributes._data = ptr_id_03->attributes;
                  attributes._size = ptr_id_03->attributes_count;
                  for (uVar37 = 0; uVar37 < attributes._size; uVar37 = uVar37 + 1) {
                    pcVar13 = tl::Span<const_cgltf_attribute>::operator[](&attributes,uVar37);
                    bVar8 = ImGui::TreeNode(pcVar13,"%ld) %s",uVar37);
                    if (bVar8) {
                      imguiAttribute(pcVar13);
                      ImGui::TreePop();
                    }
                  }
                  ImGui::TreePop();
                }
                if ((ptr_id_03->targets != (cgltf_morph_target *)0x0) &&
                   (bVar8 = ImGui::TreeNode("Morph targets"), bVar8)) {
                  attributes._data = (cgltf_attribute *)ptr_id_03->targets;
                  attributes._size = ptr_id_03->targets_count;
                  for (uVar37 = 0; uVar37 < attributes._size; uVar37 = uVar37 + 1) {
                    ptr_id = tl::Span<const_cgltf_morph_target>::operator[]
                                       ((Span<const_cgltf_morph_target> *)&attributes,uVar37);
                    if (ptr_id->attributes == (cgltf_attribute *)0x0) {
                      ImGui::Text("Attributes: (null)");
                    }
                    else {
                      bVar8 = ImGui::TreeNode(ptr_id,"Attributes");
                      if (bVar8) {
                        textures._data = (cgltf_texture *)ptr_id->attributes;
                        textures._size = ptr_id->attributes_count;
                        for (uVar29 = 0; uVar29 < textures._size; uVar29 = uVar29 + 1) {
                          pcVar13 = tl::Span<const_cgltf_attribute>::operator[]
                                              ((Span<const_cgltf_attribute> *)&textures,uVar29);
                          bVar8 = ImGui::TreeNode(pcVar13,"%ld) %s",uVar29);
                          if (bVar8) {
                            imguiAttribute(pcVar13);
                            ImGui::TreePop();
                          }
                        }
                      }
                    }
                  }
                }
                ImGui::TreePop();
              }
            }
            ImGui::TreePop();
            puVar33 = local_88;
          }
          ImGui::TreePop();
        }
      }
      ImGui::EndTabItem();
    }
    bVar8 = ImGui::BeginTabItem("Textures",(bool *)0x0,0);
    if (bVar8) {
      textures._data = parsedData->textures;
      pcVar13 = (cgltf_attribute *)parsedData->textures_count;
      local_a0._size = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
      local_a0._data = (char *)scratch._data;
      attributes._data = pcVar13;
      textures._size = (size_t)pcVar13;
      tl::toStringBuffer<char[11],unsigned_long,char[2]>
                (&local_a0,(char (*) [11])"Textures (",(unsigned_long *)&attributes,
                 (char (*) [2])scratch._data);
      bVar8 = ImGui::CollapsingHeader((char *)scratch._data,0);
      if (bVar8) {
        for (i_00 = (cgltf_attribute *)0x0; i_00 < pcVar13;
            i_00 = (cgltf_attribute *)((long)&i_00->name + 1)) {
          attributes._data = i_00;
          ptr_id_00 = tl::Span<const_cgltf_texture>::operator[](&textures,(size_t)i_00);
          local_80._size = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
          local_80._data = (char *)scratch._data;
          images._data = (cgltf_image *)ptr_id_00->name;
          if (images._data == (cgltf_image *)0x0) {
            images._data = (cgltf_image *)0x2bb39b;
          }
          tl::toStringBuffer<unsigned_long,char[3],char_const*>
                    (&local_80,(unsigned_long *)&attributes,(char (*) [3])&images,(char **)0x2bb39b)
          ;
          bVar8 = ImGui::TreeNode(ptr_id_00,"%s",scratch._data);
          if (bVar8) {
            if (ptr_id_00->image == (cgltf_image *)0x0) {
              ImGui::Text("image: (null)");
            }
            else {
              pcVar34 = (cgltf_image *)0x2c7a97;
              bVar8 = ImGui::TreeNode(&ptr_id_00->image,"image");
              if (bVar8) {
                drawGui_texturesTab::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)ptr_id_00->image,pcVar34);
                ImGui::TreePop();
              }
            }
            if (ptr_id_00->sampler == (cgltf_sampler *)0x0) {
              ImGui::Text("sampler: (null)");
            }
            else {
              pcVar11 = "sampler";
              bVar8 = ImGui::TreeNode(&ptr_id_00->sampler,"sampler");
              if (bVar8) {
                drawGui_texturesTab::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)ptr_id_00->sampler,(cgltf_sampler *)pcVar11);
                ImGui::TreePop();
              }
            }
            ImGui::TreePop();
          }
          pcVar13 = (cgltf_attribute *)textures._size;
        }
      }
      uVar10 = (uint)scratch._size;
      images._data = parsedData->images;
      pcVar34 = (cgltf_image *)parsedData->images_count;
      attributes._data = (cgltf_attribute *)scratch._data;
      attributes._size = (size_t)scratch._data;
      images._size = (size_t)pcVar34;
      requiredMem = (size_t)pcVar34;
      tl::toStringBufferT((FmtBuffer *)&attributes,"Images (");
      tl::fmtBufferAppend<unsigned_long,char[2]>((FmtBuffer *)&attributes,&requiredMem,xs);
      *(undefined1 *)(attributes._size - (uVar10 == 0)) = 0;
      bVar8 = ImGui::CollapsingHeader((char *)scratch._data,0);
      if (bVar8) {
        for (i_01 = (cgltf_image *)0x0; i_01 < pcVar34;
            i_01 = (cgltf_image *)((long)&i_01->name + 1)) {
          pcVar34 = tl::Span<const_cgltf_image>::operator[](&images,(size_t)i_01);
          bVar8 = ImGui::TreeNode(pcVar34,"%ld",i_01);
          if (bVar8) {
            pcVar34 = i_01;
            this = tl::Span<const_cgltf_image>::operator[](&images,(size_t)i_01);
            drawGui_texturesTab::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)this,pcVar34);
            ImGui::TreePop();
          }
          pcVar34 = (cgltf_image *)images._size;
        }
      }
      attributes._data = (cgltf_attribute *)parsedData->samplers;
      pcVar15 = (cgltf_sampler *)parsedData->samplers_count;
      local_40 = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
      requiredMem = (size_t)scratch._data;
      attributes._size = (size_t)pcVar15;
      local_90 = pcVar15;
      tl::toStringBuffer<char[11],unsigned_long,char[2]>
                ((Span<char> *)&requiredMem,(char (*) [11])"Samplers (",(unsigned_long *)&local_90,
                 (char (*) [2])scratch._data);
      bVar8 = ImGui::CollapsingHeader((char *)scratch._data,0);
      if (bVar8) {
        for (i_02 = (cgltf_sampler *)0x0; i_02 < pcVar15;
            i_02 = (cgltf_sampler *)((long)&i_02->mag_filter + 1)) {
          pcVar15 = tl::Span<const_cgltf_sampler>::operator[]
                              ((Span<const_cgltf_sampler> *)&attributes,(size_t)i_02);
          bVar8 = ImGui::TreeNode(pcVar15,"%ld",i_02);
          if (bVar8) {
            pcVar15 = i_02;
            this_00 = tl::Span<const_cgltf_sampler>::operator[]
                                ((Span<const_cgltf_sampler> *)&attributes,(size_t)i_02);
            drawGui_texturesTab::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)this_00,pcVar15);
            ImGui::TreePop();
          }
          pcVar15 = (cgltf_sampler *)attributes._size;
        }
      }
      ImGui::EndTabItem();
    }
    bVar8 = ImGui::BeginTabItem("Buffers",(bool *)0x0,0);
    if (bVar8) {
      textures._data = (cgltf_texture *)parsedData->buffers;
      textures._size = parsedData->buffers_count;
      for (uVar37 = 0; uVar37 < textures._size; uVar37 = uVar37 + 1) {
        pcVar16 = tl::Span<const_cgltf_buffer>::operator[]
                            ((Span<const_cgltf_buffer> *)&textures,uVar37);
        cVar32 = pcVar16->size;
        if ((drawGui_buffersTab()::unitsStrs == '\0') &&
           (iVar9 = __cxa_guard_acquire(&drawGui_buffersTab()::unitsStrs), iVar9 != 0)) {
          tl::CStrT<char>::CStrT((CStrT<char> *)drawGui_buffersTab()::unitsStrs,"bytes");
          tl::CStrT<char>::CStrT((CStrT<char> *)(drawGui_buffersTab()::unitsStrs + 0x10),"KB");
          tl::CStrT<char>::CStrT((CStrT<char> *)(drawGui_buffersTab()::unitsStrs + 0x20),"MB");
          tl::CStrT<char>::CStrT((CStrT<char> *)(drawGui_buffersTab()::unitsStrs + 0x30),"GB");
          __cxa_guard_release(&drawGui_buffersTab()::unitsStrs);
        }
        uVar10 = (uint)scratch._size;
        puVar30 = (undefined8 *)(drawGui_buffersTab()::unitsStrs + 8);
        for (; 0x400 < cVar32; cVar32 = cVar32 >> 10) {
          puVar30 = puVar30 + 2;
        }
        pcVar11 = pcVar16->uri;
        if (pcVar11 == (char *)0x0) {
          pcVar11 = "";
        }
        pcVar12 = (char *)(ulong)(uint)scratch._size;
        attributes._data = (cgltf_attribute *)scratch._data;
        attributes._size = (size_t)scratch._data;
        tl::toStringBufferT((FmtBuffer *)&attributes,uVar37);
        tl::toStringBufferT((FmtBuffer *)&attributes,") ");
        tl::toStringBufferT((FmtBuffer *)&attributes,pcVar11);
        tl::toStringBufferT((FmtBuffer *)&attributes,cVar32);
        str_00._str = pcVar12;
        str_00._0_8_ = *puVar30;
        tl::toStringBufferT((tl *)&attributes,(FmtBuffer *)(ulong)*(uint *)(puVar30 + -1),str_00);
        *(undefined1 *)(attributes._size - (uVar10 == 0)) = 0;
        ImGui::CollapsingHeader((char *)scratch._data,0);
      }
      ImGui::EndTabItem();
    }
    bVar8 = ImGui::BeginTabItem("BufferViews",(bool *)0x0,0);
    if (bVar8) {
      attributes._data = (cgltf_attribute *)parsedData->buffer_views;
      attributes._size = parsedData->buffer_views_count;
      for (puVar33 = (u8 *)0x0; local_a0._data = (char *)puVar33, puVar33 < attributes._size;
          puVar33 = puVar33 + 1) {
        pcVar17 = tl::Span<const_cgltf_buffer_view>::operator[]
                            ((Span<const_cgltf_buffer_view> *)&attributes,(size_t)puVar33);
        textures._size = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
        textures._data = (cgltf_texture *)scratch._data;
        tl::toStringBuffer<unsigned_long>((Span<char> *)&textures,(unsigned_long *)&local_a0);
        bVar8 = ImGui::CollapsingHeader((char *)scratch._data,0);
        if (bVar8) {
          ImGui::TreePush((void *)0x0);
          ImGui::Text("Type: %s",
                      _ZZL22drawGui_bufferViewsTabvE8typeStrs_rel +
                      *(int *)(_ZZL22drawGui_bufferViewsTabvE8typeStrs_rel +
                              (ulong)pcVar17->type * 4));
          ImGui::Text("Offset: %ld bytes",pcVar17->offset);
          ImGui::Text("Size: %ld bytes",pcVar17->size);
          ImGui::Text("Stride: %ld bytes",pcVar17->stride);
          lVar39 = (long)pcVar17->buffer - (long)parsedData->buffers;
          ImGui::Text("Buffer: %ld",lVar39 / 0x28,lVar39 % 0x28);
          ImGui::TreePop();
        }
      }
      ImGui::EndTabItem();
    }
    bVar8 = ImGui::BeginTabItem("Accessors",(bool *)0x0,0);
    if (bVar8) {
      attributes._data = (cgltf_attribute *)parsedData->accessors;
      attributes._size = parsedData->accessors_count;
      for (puVar33 = (u8 *)0x0; local_a0._data = (char *)puVar33, puVar33 < attributes._size;
          puVar33 = puVar33 + 1) {
        pcVar18 = tl::Span<const_cgltf_accessor>::operator[]
                            ((Span<const_cgltf_accessor> *)&attributes,(size_t)puVar33);
        textures._size = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
        textures._data = (cgltf_texture *)scratch._data;
        tl::toStringBuffer<unsigned_long>((Span<char> *)&textures,(unsigned_long *)&local_a0);
        bVar8 = ImGui::CollapsingHeader((char *)scratch._data,0);
        if (bVar8) {
          ImGui::TreePush((void *)0x0);
          imguiAccessor(pcVar18);
          ImGui::TreePop();
        }
      }
      ImGui::EndTabItem();
    }
    bVar8 = ImGui::BeginTabItem("Materials",(bool *)0x0,0);
    if (bVar8) {
      attributes._data = (cgltf_attribute *)parsedData->materials;
      attributes._size = parsedData->materials_count;
      for (puVar33 = (u8 *)0x0; local_a0._data = (char *)puVar33, puVar33 < attributes._size;
          puVar33 = puVar33 + 1) {
        material = tl::Span<const_cgltf_material>::operator[]
                             ((Span<const_cgltf_material> *)&attributes,(size_t)puVar33);
        textures._size = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
        textures._data = (cgltf_texture *)scratch._data;
        local_80._data = material->name;
        if ((u8 *)local_80._data == (u8 *)0x0) {
          local_80._data = "";
        }
        tl::toStringBuffer<unsigned_long,char[3],char_const*>
                  ((Span<char> *)&textures,(unsigned_long *)&local_a0,(char (*) [3])&local_80,
                   (char **)0x2bb39b);
        bVar8 = ImGui::CollapsingHeader((char *)scratch._data,0);
        if (bVar8) {
          ImGui::TreePush((void *)0x0);
          imguiMaterial(material);
          ImGui::TreePop();
        }
      }
      ImGui::EndTabItem();
    }
    bVar8 = ImGui::BeginTabItem("Skins",(bool *)0x0,0);
    if (bVar8) {
      attributes._data = (cgltf_attribute *)parsedData->skins;
      attributes._size = parsedData->skins_count;
      for (uVar37 = 0; uVar37 < attributes._size; uVar37 = uVar37 + 1) {
        pcVar19 = tl::Span<const_cgltf_skin>::operator[]
                            ((Span<const_cgltf_skin> *)&attributes,uVar37);
        bVar8 = ImGui::TreeNode(pcVar19,"%ld) %s",uVar37);
        if (bVar8) {
          textures._data = (cgltf_texture *)pcVar19->joints;
          textures._size = pcVar19->joints_count;
          bVar8 = ImGui::TreeNode(textures._data,"joints(%ld)");
          if (bVar8) {
            for (uVar29 = 0; uVar29 < textures._size; uVar29 = uVar29 + 1) {
              ppcVar20 = tl::Span<cgltf_node_*const>::operator[]
                                   ((Span<cgltf_node_*const> *)&textures,uVar29);
              pcVar4 = *ppcVar20;
              if (pcVar4 == pcVar19->skeleton) {
                ImGui::PushStyleColor(0,0xff0000ff);
              }
              ImGui::Text("%ld) %ld %s",uVar29,((long)pcVar4 - (long)parsedData->nodes) / 0xd8);
              if (pcVar4 == pcVar19->skeleton) {
                ImGui::PopStyleColor(1);
              }
            }
            ImGui::TreePop();
          }
          ImGui::TreePop();
        }
      }
      ImGui::EndTabItem();
    }
    bVar8 = ImGui::BeginTabItem("Animations",(bool *)0x0,0);
    if (bVar8) {
      textures._data = (cgltf_texture *)parsedData->animations;
      textures._size = parsedData->animations_count;
      for (puVar33 = (u8 *)0x0; local_38 = puVar33, puVar33 < textures._size; puVar33 = puVar33 + 1)
      {
        pcVar21 = tl::Span<const_cgltf_animation>::operator[]
                            ((Span<const_cgltf_animation> *)&textures,(size_t)puVar33);
        local_a0._size = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
        local_a0._data = (char *)scratch._data;
        attributes._data = (cgltf_attribute *)pcVar21->name;
        if (attributes._data == (cgltf_attribute *)0x0) {
          attributes._data = (cgltf_attribute *)0x27ae4b;
        }
        tl::toStringBuffer<unsigned_long,char[3],char_const*>
                  (&local_a0,(unsigned_long *)&local_38,(char (*) [3])&attributes,(char **)0x27ae4b)
        ;
        bVar8 = ImGui::CollapsingHeader((char *)scratch._data,0);
        if (bVar8) {
          ImGui::TreePush((void *)0x0);
          local_88 = puVar33;
          if (puVar33 == (u8 *)((long)(int)anims::playingInd + -1)) {
            attributes._data = (cgltf_attribute *)0x0;
            bVar8 = ImGui::Button(anon_var_dwarf_b2d0,(ImVec2 *)&attributes);
            if (bVar8) {
              anims::playingInd = -anims::playingInd;
            }
          }
          else {
            attributes._data = (cgltf_attribute *)0x0;
            bVar8 = ImGui::Button(anon_var_dwarf_b30c,(ImVec2 *)&attributes);
            if (bVar8) {
              if (-1 < (int)anims::playingInd || local_88 != (u8 *)(ulong)~anims::playingInd) {
                anims::time = 0.0;
              }
              anims::playingInd = (int)local_88 + 1;
              tl::Vector<anims::NodeData>::resize<>
                        ((Vector<anims::NodeData> *)&anims::nodesData,parsedData->nodes_count);
              pcVar7 = parsedData;
              memset(anims::nodesData,0,parsedData->nodes_count * 0x18);
              attributes._data = (cgltf_attribute *)pcVar7->animations;
              attributes._size = pcVar7->animations_count;
              requiredMem = 0;
              if (0 < (int)anims::playingInd) {
                pcVar22 = tl::Span<const_cgltf_animation>::operator[]
                                    ((Span<const_cgltf_animation> *)&attributes,
                                     (ulong)(anims::playingInd - 1));
                pcVar31 = pcVar22->channels;
                for (lVar39 = pcVar22->channels_count * 0x28; lVar39 != 0; lVar39 = lVar39 + -0x28)
                {
                  advanceAnimPathOffset(&requiredMem,pcVar31->target_path);
                  pcVar31 = pcVar31 + 1;
                }
              }
              tl::Vector<float>::resize<>((Vector<float> *)anims::animData,requiredMem);
              local_90 = (cgltf_sampler *)0x0;
              lVar39 = (long)(int)anims::playingInd;
              if (0 < lVar39) {
                pcVar22 = parsedData->animations;
                tl::Vector<int>::resize<>
                          ((Vector<int> *)&anims::curKeyInds,pcVar22[lVar39 + -1].samplers_count);
                lVar40 = anims::curKeyInds;
                lVar27 = DAT_0032c990 * 4;
                for (lVar28 = 0; lVar27 != lVar28; lVar28 = lVar28 + 4) {
                  *(undefined4 *)(lVar40 + lVar28) = 0xffffffff;
                }
                pcVar31 = pcVar22[lVar39 + -1].channels;
                for (lVar40 = pcVar22[lVar39 + -1].channels_count * 0x28; lVar40 != 0;
                    lVar40 = lVar40 + -0x28) {
                  i = ((long)pcVar31->target_node - (long)parsedData->nodes) / 0xd8;
                  cVar2 = pcVar31->target_path;
                  if (cVar2 == cgltf_animation_path_type_scale) {
                    pvVar23 = (vec3 *)tl::Vector<float>::operator[]
                                                ((Vector<float> *)anims::animData,(size_t)local_90);
                    pNVar24 = tl::Vector<anims::NodeData>::operator[]
                                        ((Vector<anims::NodeData> *)&anims::nodesData,i);
                    pNVar24->scale = pvVar23;
                  }
                  else if (cVar2 == cgltf_animation_path_type_rotation) {
                    pqVar25 = (quat *)tl::Vector<float>::operator[]
                                                ((Vector<float> *)anims::animData,(size_t)local_90);
                    pNVar24 = tl::Vector<anims::NodeData>::operator[]
                                        ((Vector<anims::NodeData> *)&anims::nodesData,i);
                    pNVar24->rotation = pqVar25;
                  }
                  else {
                    if (cVar2 != cgltf_animation_path_type_translation) {
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                                    ,0x1a4,"void anims::initAnim()");
                    }
                    pvVar23 = (vec3 *)tl::Vector<float>::operator[]
                                                ((Vector<float> *)anims::animData,(size_t)local_90);
                    pNVar24 = tl::Vector<anims::NodeData>::operator[]
                                        ((Vector<anims::NodeData> *)&anims::nodesData,i);
                    pNVar24->position = pvVar23;
                  }
                  advanceAnimPathOffset((size_t *)&local_90,pcVar31->target_path);
                  pcVar31 = pcVar31 + 1;
                }
                anims::duration = 0.0;
                for (lVar40 = 0; pcVar22[lVar39 + -1].samplers_count * 0x28 - lVar40 != 0;
                    lVar40 = lVar40 + 0x28) {
                  lVar27 = *(long *)((long)&(pcVar22[lVar39 + -1].samplers)->input + lVar40);
                  if (*(int *)(lVar27 + 0x74) == 0) {
                    __assert_fail("sampler.input->has_max",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                                  ,0x1ac,"void anims::initAnim()");
                  }
                  fVar42 = *(float *)(lVar27 + 0x78);
                  if (fVar42 <= anims::duration) {
                    fVar42 = anims::duration;
                  }
                  anims::duration = fVar42;
                }
              }
            }
          }
          ImGui::SameLine(0.0,-1.0);
          attributes._data = (cgltf_attribute *)0x0;
          bVar8 = ImGui::Button(anon_var_dwarf_b317,(ImVec2 *)&attributes);
          if (bVar8) {
            anims::playingInd = 0;
            anims::time = 0.0;
            uVar41 = 0;
          }
          else {
            uVar41 = SUB84((double)anims::time,0);
          }
          ImGui::Text("time: %g / %g",uVar41,(double)anims::duration);
          bVar8 = ImGui::TreeNode(&pcVar21->channels,"channels");
          if (bVar8) {
            lVar39 = 0x10;
            for (pcVar13 = (cgltf_attribute *)0x0; attributes._data = pcVar13,
                pcVar13 < (cgltf_attribute *)pcVar21->channels_count;
                pcVar13 = (cgltf_attribute *)((long)&pcVar13->name + 1)) {
              pcVar31 = pcVar21->channels;
              local_80._size = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
              local_80._data = (char *)scratch._data;
              tl::toStringBuffer<unsigned_long>(&local_80,(unsigned_long *)&attributes);
              bVar8 = ImGui::TreeNode((char *)scratch._data);
              if (bVar8) {
                lVar40 = *(long *)((long)pcVar31 + lVar39 + -0x10);
                puVar30 = *(undefined8 **)((long)pcVar31 + lVar39 + -8);
                pcVar38 = pcVar21->samplers;
                ImGui::Text("target node: %d) %s",
                            ((long)puVar30 - (long)parsedData->nodes) / 0xd8 & 0xffffffff,*puVar30);
                pcVar11 = cgltfAnimationPathStr
                                    (*(cgltf_animation_path_type *)
                                      ((long)&pcVar31->sampler + lVar39));
                ImGui::Text("target path: %s",pcVar11);
                ImGui::Text("sampler: %d",(lVar40 - (long)pcVar38) / 0x28 & 0xffffffff);
                ImGui::TreePop();
              }
              lVar39 = lVar39 + 0x28;
            }
            ImGui::TreePop();
          }
          bVar8 = ImGui::TreeNode(&pcVar21->samplers,"samplers");
          if (bVar8) {
            for (uVar37 = 0; requiredMem = uVar37, uVar37 < pcVar21->samplers_count;
                uVar37 = uVar37 + 1) {
              pcVar38 = pcVar21->samplers + uVar37;
              images._size = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
              images._data = (cgltf_image *)scratch._data;
              tl::toStringBuffer<unsigned_long>((Span<char> *)&images,&requiredMem);
              bVar8 = ImGui::TreeNode((char *)scratch._data);
              if (bVar8) {
                pcVar11 = cgltfInterpolationStr(pcVar38->interpolation);
                ImGui::Text("interpolation type: %s",pcVar11);
                pcVar11 = cgltfComponentTypeStr(pcVar38->input->component_type);
                ImGui::Text("Input compType: %s",pcVar11);
                attributes._data = (cgltf_attribute *)0xbf800000;
                bVar8 = ImPlot::BeginPlot("","t",(char *)0x0,(ImVec2 *)&attributes,0,0,0,2,2,
                                          (char *)0x0,(char *)0x0);
                if (bVar8) {
                  attributes._size = attributes._size & 0xffffffff00000000;
                  attributes._data = (cgltf_attribute *)pcVar38;
                  uVar10 = cgltfTypeNumComponents(pcVar38->output->type);
                  if ((int)uVar10 < 5) {
                    if ((int)uVar10 < 1) {
                      uVar10 = 0;
                    }
                    puVar30 = &DAT_003220c0;
                    for (uVar29 = 0; uVar10 != uVar29; uVar29 = uVar29 + 1) {
                      attributes._size = CONCAT44(attributes._size._4_4_,(int)uVar29);
                      pcVar11 = (char *)*puVar30;
                      ImPlot::PlotLineG(pcVar11,sampleAnimDataForPlotting,&attributes,
                                        (int)pcVar38->input->count,0);
                      ImPlot::PlotScatterG
                                (pcVar11,sampleAnimDataForPlotting,&attributes,
                                 (int)pcVar38->input->count,0);
                      puVar30 = puVar30 + 1;
                    }
                  }
                  ImPlot::EndPlot();
                }
                ImGui::TreePop();
              }
            }
            ImGui::TreePop();
          }
          ImGui::TreePop();
          puVar33 = local_88;
        }
      }
      ImGui::EndTabItem();
    }
    bVar8 = ImGui::BeginTabItem("Cameras",(bool *)0x0,0);
    if (bVar8) {
      textures._data = (cgltf_texture *)parsedData->cameras;
      cVar32 = parsedData->cameras_count;
      textures._size = cVar32;
      bVar8 = ImGui::BeginCombo("Use camera","[DEFAULT ORBIT]",0);
      if (bVar8) {
        for (ptr_id_04 = (void *)0xffffffffffffffff; (long)ptr_id_04 < (long)cVar32;
            ptr_id_04 = (void *)((long)ptr_id_04 + 1)) {
          ImGui::PushID(ptr_id_04);
          uVar10 = (uint)scratch._size;
          pcVar11 = "[DEFAULT ORBIT]";
          uVar36 = (uint)ptr_id_04;
          if (-1 < (int)uVar36) {
            if ((int)parsedData->cameras_count <= (int)uVar36) {
              __assert_fail("ind < (int)parsedData->cameras_count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                            ,0x16a,"const char *getCameraName(int)");
            }
            pcVar11 = parsedData->cameras[uVar36 & 0x7fffffff].name;
            pcVar12 = "(null)";
            if (pcVar11 != (char *)0x0) {
              pcVar12 = pcVar11;
            }
            attributes._data = (cgltf_attribute *)scratch._data;
            attributes._size = (size_t)scratch._data;
            tl::toStringBufferT((FmtBuffer *)&attributes,"%d) %s");
            tl::toStringBufferT((FmtBuffer *)&attributes,pcVar12);
            *(undefined1 *)(attributes._size - (uVar10 == 0)) = 0;
            pcVar11 = (char *)scratch._data;
          }
          attributes._data = (cgltf_attribute *)0x0;
          bVar8 = ImGui::Selectable(pcVar11,false,0,(ImVec2 *)&attributes);
          if (bVar8) {
            imgui_state::selectedSceneInd = uVar36;
          }
          ImGui::PopID();
        }
        ImGui::EndCombo();
      }
      bVar8 = ImGui::CollapsingHeader("Cameras",0);
      if (bVar8) {
        for (uVar37 = 0; uVar37 < cVar32; uVar37 = uVar37 + 1) {
          ptr_id_01 = tl::Span<const_cgltf_camera>::operator[]
                                ((Span<const_cgltf_camera> *)&textures,uVar37);
          bVar8 = ImGui::TreeNode(ptr_id_01,"%ld) %s",uVar37);
          if (bVar8) {
            ImGui::Text("Name: %s",ptr_id_01->name);
            cgltfCameraTypeStr(ptr_id_01->type);
            ImGui::Text("Type: %s");
            if (ptr_id_01->type == cgltf_camera_type_orthographic) {
              ImGui::Text("SizeXY: %g x %g",
                          SUB84((double)(ptr_id_01->data).perspective.aspect_ratio,0),
                          (double)(ptr_id_01->data).perspective.yfov);
LAB_00114c3e:
              ImGui::Text("Near: %g",SUB84((double)(ptr_id_01->data).perspective.znear,0));
              ImGui::Text("Far: %g",SUB84((double)(ptr_id_01->data).perspective.zfar,0));
            }
            else if (ptr_id_01->type == cgltf_camera_type_perspective) {
              ImGui::Text("Aspect ratio: %g",
                          SUB84((double)(ptr_id_01->data).perspective.aspect_ratio,0));
              ImGui::Text("Fov Y: %g",SUB84((double)(ptr_id_01->data).perspective.yfov,0));
              goto LAB_00114c3e;
            }
            ImGui::TreePop();
          }
          cVar32 = textures._size;
        }
      }
      ImGui::EndTabItem();
    }
    bVar8 = ImGui::BeginTabItem("Lights",(bool *)0x0,0);
    if (bVar8) {
      textures._data = (cgltf_texture *)parsedData->lights;
      textures._size = parsedData->lights_count;
      for (uVar37 = 0; uVar37 < textures._size; uVar37 = uVar37 + 1) {
        pcVar26 = tl::Span<const_cgltf_light>::operator[]
                            ((Span<const_cgltf_light> *)&textures,uVar37);
        bVar8 = ImGui::TreeNode(&parsedData->lights,"%ld) %s",uVar37);
        if (bVar8) {
          ImGui::Text("Name: %s",pcVar26->name);
          ImGui::Text("Color: ");
          ImGui::SameLine(0.0,-1.0);
          uVar1 = *(undefined8 *)pcVar26->color;
          attributes._data = *(cgltf_attribute **)pcVar26->color;
          attributes._size = CONCAT44(0x3f800000,pcVar26->color[2]);
          ImGui::TextColored((ImVec4 *)&attributes,"(%g, %g, %g)",SUB84((double)(float)uVar1,0),
                             (double)(float)((ulong)uVar1 >> 0x20),(double)pcVar26->color[2]);
          ImGui::Text("Intensity: %g",SUB84((double)pcVar26->intensity,0));
          ImGui::Text("Range: %g",SUB84((double)pcVar26->range,0));
          if (cgltf_light_type_spot < pcVar26->type) {
            __assert_fail("(size_t)light.type < tl::size(lightTypeStrs)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                          ,0x302,"void imguiLight(const cgltf_light &)");
          }
          ImGui::Text("Type: %s");
          if (pcVar26->type == cgltf_light_type_spot) {
            ImGui::Text("Inner cone angle: %g",SUB84((double)pcVar26->spot_inner_cone_angle,0));
            ImGui::Text("Outer cone angle: %g",SUB84((double)pcVar26->spot_outer_cone_angle,0));
          }
          ImGui::TreePop();
        }
      }
      ImGui::EndTabItem();
    }
    bVar8 = ImGui::BeginTabItem("Options",(bool *)0x0,0);
    if (bVar8) {
      bVar8 = ImGui::TreeNode("Orbit camera");
      if (bVar8) {
        ImGui::SliderFloat("Near",&camProjInfo.nearDist,0.0001,0.5,"%.3f",0);
        ImGui::SliderFloat("Far",&camProjInfo.farDist,camProjInfo.nearDist,100000.0,"%.3f",3);
        if (camProjInfo.farDist <= camProjInfo.nearDist + camProjInfo.nearDist) {
          camProjInfo.farDist = camProjInfo.nearDist + camProjInfo.nearDist;
        }
        ImGui::SliderAngle("FOV Y",&camProjInfo.fovY,1.0,175.0,"%.0f deg",0);
        ImGui::TreePop();
      }
      ImGui::Checkbox("Show axes",(bool *)&imgui_state::showAxes);
      ImGui::Checkbox("Show floor grid",(bool *)&imgui_state::showFloorGrid);
      ImGui::Checkbox("Show crosshair",(bool *)&imgui_state::showCrosshair);
      ImGui::SliderFloat("Crosshair scale",(float *)&imgui_state::crosshairScale,0.0,0.1,"%.3f",0);
      ImGui::EndTabItem();
    }
    ImGui::EndTabBar();
  }
  ImGui::End();
  return;
}

Assistant:

void drawGui()
{
    if(!parsedData) {
        ImGui::Begin("drag & drop a glTF file##0");
        ImGui::End();
        return;
    }

    ImGui::PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(1,1));
    tl::toStringBuffer(scratchStr(), openedFilePath, "##0");
    ImGui::Begin(scratchStr());
    ImGui::PopStyleVar();

    if (ImGui::BeginTabBar("TopTabBar"))
    {
        if (ImGui::BeginTabItem("Scenes")) {
            drawGui_scenesTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Meshes")) {
            drawGui_meshesTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Textures")) {
            drawGui_texturesTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Buffers")) {
            drawGui_buffersTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("BufferViews")) {
            drawGui_bufferViewsTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Accessors")) {
            drawGui_accessorsTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Materials")) {
            drawGui_materialsTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Skins")) {
            drawGui_skins();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Animations")) {
            drawGui_animations();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Cameras")) {
            drawGui_cameras();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Lights")) {
            drawGui_lights();
            ImGui::EndTabItem();
        }

        if(ImGui::BeginTabItem("Options")) {
            drawGui_options();
            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::End();
}